

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::AppendSuccessInformation(cmFindPackageCommand *this)

{
  bool bVar1;
  cmState *pcVar2;
  char *pcVar3;
  char *val;
  ulong uVar4;
  char *local_1b0;
  bool local_18a;
  allocator local_151;
  undefined1 local_150 [8];
  string requiredInfoPropName;
  string versionInfo;
  undefined1 local_108 [8];
  string versionInfoPropName;
  undefined1 local_e0 [8];
  string quietInfoPropName;
  bool packageFound;
  char *result;
  char *upperResult;
  string upperFound;
  string found;
  allocator local_31;
  undefined1 local_30 [8];
  string transitivePropName;
  cmFindPackageCommand *this_local;
  
  transitivePropName.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"_CMAKE_",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&found.field_2 + 8),&this->Name,"_TRANSITIVE_DEPENDENCY");
  std::__cxx11::string::operator+=((string *)local_30,(string *)(found.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(found.field_2._M_local_buf + 8));
  pcVar2 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
  cmState::SetGlobalProperty(pcVar2,(string *)local_30,"False");
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::string
            ((string *)(upperFound.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)(upperFound.field_2._M_local_buf + 8),"_FOUND");
  cmsys::SystemTools::UpperCase((string *)&upperResult,(string *)((long)&upperFound.field_2 + 8));
  pcVar3 = cmMakefile::GetDefinition
                     ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)&upperResult);
  val = cmMakefile::GetDefinition
                  ((this->super_cmFindCommon).super_cmCommand.Makefile,
                   (string *)((long)&upperFound.field_2 + 8));
  bVar1 = cmSystemTools::IsOn(val);
  local_18a = true;
  if (!bVar1) {
    local_18a = cmSystemTools::IsOn(pcVar3);
  }
  quietInfoPropName.field_2._M_local_buf[0xf] = local_18a;
  AppendToFoundProperty(this,local_18a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_e0,"_CMAKE_",
             (allocator *)(versionInfoPropName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(versionInfoPropName.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=((string *)local_e0,(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)local_e0,"_QUIET");
  pcVar2 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
  pcVar3 = "FALSE";
  if ((this->Quiet & 1U) != 0) {
    pcVar3 = "TRUE";
  }
  cmState::SetGlobalProperty(pcVar2,(string *)local_e0,pcVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_108,"_CMAKE_",(allocator *)(versionInfo.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(versionInfo.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=((string *)local_108,(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)local_108,"_REQUIRED_VERSION");
  std::__cxx11::string::string((string *)(requiredInfoPropName.field_2._M_local_buf + 8));
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    if ((this->VersionExact & 1U) == 0) {
      local_1b0 = ">=";
    }
    else {
      local_1b0 = "==";
    }
    std::__cxx11::string::operator=
              ((string *)(requiredInfoPropName.field_2._M_local_buf + 8),local_1b0);
    std::__cxx11::string::operator+=((string *)(requiredInfoPropName.field_2._M_local_buf + 8)," ");
    std::__cxx11::string::operator+=
              ((string *)(requiredInfoPropName.field_2._M_local_buf + 8),(string *)&this->Version);
  }
  pcVar2 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmState::SetGlobalProperty(pcVar2,(string *)local_108,pcVar3);
  if ((this->Required & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_150,"_CMAKE_",&local_151);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::__cxx11::string::operator+=((string *)local_150,(string *)&this->Name);
    std::__cxx11::string::operator+=((string *)local_150,"_TYPE");
    pcVar2 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
    cmState::SetGlobalProperty(pcVar2,(string *)local_150,"REQUIRED");
    std::__cxx11::string::~string((string *)local_150);
  }
  RestoreFindDefinitions(this);
  std::__cxx11::string::~string((string *)(requiredInfoPropName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)&upperResult);
  std::__cxx11::string::~string((string *)(upperFound.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmFindPackageCommand::AppendSuccessInformation()
{
  {
  std::string transitivePropName = "_CMAKE_";
  transitivePropName += this->Name + "_TRANSITIVE_DEPENDENCY";
  this->Makefile->GetState()
                ->SetGlobalProperty(transitivePropName, "False");
  }
  std::string found = this->Name;
  found += "_FOUND";
  std::string upperFound = cmSystemTools::UpperCase(found);

  const char* upperResult = this->Makefile->GetDefinition(upperFound);
  const char* result = this->Makefile->GetDefinition(found);
  bool packageFound = ((cmSystemTools::IsOn(result))
                                        || (cmSystemTools::IsOn(upperResult)));

  this->AppendToFoundProperty(packageFound);

  // Record whether the find was quiet or not, so this can be used
  // e.g. in FeatureSummary.cmake
  std::string quietInfoPropName = "_CMAKE_";
  quietInfoPropName += this->Name;
  quietInfoPropName += "_QUIET";
  this->Makefile->GetState()
      ->SetGlobalProperty(quietInfoPropName, this->Quiet ? "TRUE" : "FALSE");

  // set a global property to record the required version of this package
  std::string versionInfoPropName = "_CMAKE_";
  versionInfoPropName += this->Name;
  versionInfoPropName += "_REQUIRED_VERSION";
  std::string versionInfo;
  if(!this->Version.empty())
    {
    versionInfo = this->VersionExact ? "==" : ">=";
    versionInfo += " ";
    versionInfo += this->Version;
    }
  this->Makefile->GetState()
      ->SetGlobalProperty(versionInfoPropName, versionInfo.c_str());
  if (this->Required)
    {
    std::string requiredInfoPropName = "_CMAKE_";
    requiredInfoPropName += this->Name;
    requiredInfoPropName += "_TYPE";
    this->Makefile->GetState()
        ->SetGlobalProperty(requiredInfoPropName, "REQUIRED");
    }


  // Restore original state of "_FIND_" variables we set.
  this->RestoreFindDefinitions();
}